

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::AsyncOutputStream,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::reject
          (Connection *this,uint statusCode,StringPtr statusText,HttpHeaders *headers,
          Maybe<unsigned_long> *expectedBodySize)

{
  PromiseArenaMember *node;
  undefined8 *puVar1;
  char *pcVar2;
  size_t sVar3;
  char (*params) [32];
  AsyncOutputStream *extraout_RDX;
  PromiseNode *ptrCopy;
  undefined4 in_register_00000034;
  long lVar4;
  bool bVar5;
  Own<kj::AsyncOutputStream,_std::nullptr_t> OVar6;
  char *in_stack_00000008;
  DebugExpression<bool> _kjCondition;
  Fault f;
  LoopResult local_1fc;
  String local_1f8;
  char (*local_1e0) [32];
  char *local_1d8;
  char local_1d0;
  undefined8 local_1c8;
  Exception local_1c0;
  
  lVar4 = CONCAT44(in_register_00000034,statusCode);
  local_1d8 = statusText.content.ptr;
  if (*(char *)(lVar4 + 0x148) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1fad,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal((Fault *)&local_1c0);
  }
  bVar5 = *(int *)(lVar4 + 0x150) == 2;
  local_1fc = CONCAT31(local_1fc._1_3_,bVar5);
  if (!bVar5) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
              ((Fault *)&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1fae,FAILED,"method.is<HttpConnectMethod>()",
               "_kjCondition,\"Only use reject() with CONNECT requests.\"",
               (DebugExpression<bool> *)&local_1fc,
               (char (*) [41])"Only use reject() with CONNECT requests.");
    kj::_::Debug::Fault::fatal((Fault *)&local_1c0);
  }
  bVar5 = (int)statusText.content.ptr - 300U < 0xffffff9c;
  local_1fc = CONCAT31(local_1fc._1_3_,bVar5);
  if (!bVar5) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[43]>
              ((Fault *)&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1faf,FAILED,"statusCode < 200 || statusCode >= 300",
               "_kjCondition,\"the statusCode must not be 2xx for reject.\"",(bool *)&local_1fc,
               (char (*) [43])"the statusCode must not be 2xx for reject.");
    kj::_::Debug::Fault::fatal((Fault *)&local_1c0);
  }
  local_1fc = BREAK_LOOP_CONN_OK;
  params = (char (*) [32])statusText.content.size_;
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediatePromiseNode<kj::HttpServer::Connection::LoopResult>,kj::_::PromiseDisposer,kj::HttpServer::Connection::LoopResult>
            ((PromiseDisposer *)&local_1c0,&local_1fc);
  if (*(char *)(lVar4 + 0x178) == '\x01') {
    *(undefined1 *)(lVar4 + 0x178) = 0;
    node = *(PromiseArenaMember **)(lVar4 + 0x180);
    if (node != (PromiseArenaMember *)0x0) {
      *(undefined8 *)(lVar4 + 0x180) = 0;
      kj::_::PromiseDisposer::dispose(node);
    }
  }
  *(char **)(lVar4 + 0x180) = local_1c0.ownFile.content.ptr;
  *(undefined1 *)(lVar4 + 0x178) = 1;
  if (*(long *)(lVar4 + 400) != 0) {
    puVar1 = *(undefined8 **)(lVar4 + 400);
    local_1e0 = (char (*) [32])statusText.content.size_;
    kj::_::Debug::makeDescription<char_const(&)[32]>
              (&local_1f8,(Debug *)"\"the tunnel request was rejected\"",
               "the tunnel request was rejected",params);
    Exception::Exception
              (&local_1c0,DISCONNECTED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1fb3,&local_1f8);
    (**(code **)*puVar1)(puVar1,&local_1c0);
    Exception::~Exception(&local_1c0);
    sVar3 = local_1f8.content.size_;
    pcVar2 = local_1f8.content.ptr;
    if (local_1f8.content.ptr != (char *)0x0) {
      local_1f8.content.ptr = (char *)0x0;
      local_1f8.content.size_ = 0;
      (**(local_1f8.content.disposer)->_vptr_ArrayDisposer)
                (local_1f8.content.disposer,pcVar2,1,sVar3,sVar3,0);
    }
    *(undefined1 *)(lVar4 + 0x164) = 1;
    local_1d0 = *in_stack_00000008;
    if (local_1d0 == '\x01') {
      local_1c8 = *(undefined8 *)(in_stack_00000008 + 8);
    }
    send(this,statusCode,local_1d8,(size_t)local_1e0,(int)headers);
    OVar6.ptr = extraout_RDX;
    OVar6.disposer = (Disposer *)this;
    return OVar6;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
            ((Fault *)&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fb2,FAILED,"tunnelWriteGuard != nullptr",
             "\"the tunnel stream was not initialized\"",
             (char (*) [38])"the tunnel stream was not initialized");
  kj::_::Debug::Fault::fatal((Fault *)&local_1c0);
}

Assistant:

kj::Own<kj::AsyncOutputStream> reject(
      uint statusCode,
      kj::StringPtr statusText,
      const HttpHeaders& headers,
      kj::Maybe<uint64_t> expectedBodySize) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    KJ_REQUIRE(method.is<HttpConnectMethod>(), "Only use reject() with CONNECT requests.");
    KJ_REQUIRE(statusCode < 200 || statusCode >= 300, "the statusCode must not be 2xx for reject.");
    tunnelRejected = Maybe<kj::Promise<LoopResult>>(BREAK_LOOP_CONN_OK);

    auto& fulfiller = KJ_ASSERT_NONNULL(tunnelWriteGuard, "the tunnel stream was not initialized");
    fulfiller->reject(KJ_EXCEPTION(DISCONNECTED, "the tunnel request was rejected"));
    closeAfterSend = true;
    return send(statusCode, statusText, headers, expectedBodySize);
  }